

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

Function * __thiscall
backend::codegen::Codegen::translate_function(Function *__return_storage_ptr__,Codegen *this)

{
  uint uVar1;
  pointer puVar2;
  Inst *pIVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
  *this_00;
  pointer pcVar4;
  MirFunction *pMVar5;
  _Base_ptr p_Var6;
  Function *pFVar7;
  char cVar8;
  ConditionCode CVar9;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i;
  Codegen *blk;
  Codegen *pCVar10;
  ostream *poVar11;
  pointer puVar12;
  _Rb_tree_node_base *p_Var13;
  iterator iVar14;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var15;
  size_t *psVar16;
  Codegen *pCVar17;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i_2;
  pointer puVar18;
  Codegen *pCVar19;
  char *pcVar20;
  iterator __position;
  long *plVar21;
  Tag *pTVar22;
  pointer *__ptr;
  pointer puVar23;
  Codegen *pCVar24;
  pointer *__ptr_1;
  bool bVar25;
  uint bb_id;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> vis;
  ostream local_191;
  char *local_190;
  _Hash_node_base *local_188;
  char local_180;
  undefined7 uStack_17f;
  undefined8 uStack_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  _Base_ptr local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  uint local_14c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_148;
  undefined1 local_118 [40];
  _Alloc_hider local_f0;
  _Base_ptr p_Stack_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  size_t local_d0;
  bool local_c8;
  undefined **local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  Codegen *local_a8;
  Codegen *local_a0;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  local_98;
  shared_ptr<mir::types::FunctionTy> local_78;
  Function *local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  __position._M_current = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)this;
  local_68 = __return_storage_ptr__;
  init_reg_map(this);
  scan_stack(this);
  scan(this);
  generate_startup(this);
  local_98.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98.
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->inst).
       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar18 = (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_a8 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (puVar18 !=
      (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0 = (Codegen *)&(this->inline_hint)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_14c = *puVar18;
      puVar12 = (local_a8->inst).
                super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (local_a8->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar23 = puVar12;
      if (puVar2 != puVar12) {
        do {
          pIVar3 = (puVar23->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                   ._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
          if (pIVar3 != (Inst *)0x0) {
            (*(pIVar3->super_Displayable)._vptr_Displayable[2])();
          }
          (puVar23->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
          super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
          puVar23 = puVar23 + 1;
        } while (puVar23 != puVar2);
        (local_a8->inst).
        super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar12;
      }
      pCVar24 = local_a8;
      local_118._0_4_ = local_14c;
      blk = (Codegen *)
            std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at(&local_a8->func->basic_blks,(key_type *)local_118);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&local_60,&local_14c);
      pCVar17 = local_a0;
      __position._M_current = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)blk;
      translate_basic_block(pCVar24,(BasicBlk *)blk);
      (pCVar24->second_last_condition_code).super__Optional_base<arm::ConditionCode,_true,_true>.
      _M_payload.super__Optional_payload_base<arm::ConditionCode> =
           (_Optional_payload_base<arm::ConditionCode>)0x0;
      pCVar10 = pCVar17;
      for (pCVar19 = (Codegen *)
                     (pCVar24->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          pCVar19 != (Codegen *)0x0;
          pCVar19 = *(Codegen **)
                     (&(((set<int,_std::less<int>,_std::allocator<int>_> *)&pCVar19->extra_data)->
                       _M_t)._M_impl.field_0x0 + (long)__position._M_current * 8)) {
        bVar25 = *(uint *)&(((_Rb_tree_header *)&pCVar19->inst)->_M_header)._M_parent < local_14c;
        __position._M_current =
             (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)(ulong)bVar25;
        if (!bVar25) {
          pCVar10 = pCVar19;
        }
      }
      pCVar19 = pCVar17;
      if ((pCVar10 != pCVar17) &&
         (pCVar19 = pCVar10,
         local_14c < *(uint *)&(((_Rb_tree_header *)&pCVar10->inst)->_M_header)._M_parent)) {
        pCVar19 = pCVar17;
      }
      if ((pCVar24->enable_cond_exec == true) && (pCVar19 != local_a0)) {
        local_191 = (ostream)0x0;
        AixLog::operator<<(&local_191,(Severity *)__position._M_current);
        local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
        local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
        local_148.first.field_2._M_allocated_capacity = 0;
        local_148.first.field_2._M_local_buf[8] = '\0';
        local_148.second._M_storage._0_1_ = 1;
        AixLog::operator<<((ostream *)&local_148,(Tag *)__position._M_current);
        local_b8 = std::chrono::_V2::system_clock::now();
        local_c0 = &PTR__Timestamp_001edeb0;
        local_b0 = 0;
        AixLog::operator<<((ostream *)&local_c0,(Timestamp *)__position._M_current);
        local_190 = &local_180;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,"translate_function","");
        local_170 = &local_160;
        pcVar20 = 
        "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                   ,"");
        local_118._0_8_ = &PTR__Function_001edf10;
        local_118._8_8_ = local_118 + 0x18;
        if (local_190 == &local_180) {
          local_118._32_8_ = uStack_178;
        }
        else {
          local_118._8_8_ = local_190;
        }
        local_118._25_7_ = uStack_17f;
        local_118[0x18] = local_180;
        local_118._16_8_ = local_188;
        local_188 = (_Hash_node_base *)0x0;
        local_180 = '\0';
        local_f0._M_p = (pointer)&local_e0;
        if (local_170 == &local_160) {
          local_e0._8_8_ = local_160._8_8_;
        }
        else {
          local_f0._M_p = (pointer)local_170;
        }
        local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
        local_e0._M_local_buf[0] = local_160._M_local_buf[0];
        p_Stack_e8 = local_168;
        local_168 = (_Base_ptr)0x0;
        local_160._M_local_buf[0] = '\0';
        local_d0 = 0x27;
        local_c8 = false;
        local_190 = &local_180;
        local_170 = &local_160;
        AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"Found inline hint for ",0x16);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
        cVar8 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        __position._M_current =
             (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)(ulong)(uint)(int)cVar8;
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        AixLog::Function::~Function((Function *)local_118);
        if (local_170 != &local_160) {
          __position._M_current =
               (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
               (CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1);
          operator_delete(local_170,(ulong)__position._M_current);
        }
        if (local_190 != &local_180) {
          __position._M_current =
               (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
               (CONCAT71(uStack_17f,local_180) + 1);
          operator_delete(local_190,(ulong)__position._M_current);
        }
        local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
        if ((undefined1 *)local_148.first._M_string_length !=
            (undefined1 *)((long)&local_148.first.field_2 + 8)) {
          __position._M_current =
               (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
               (CONCAT71(local_148.first.field_2._9_7_,local_148.first.field_2._M_local_buf[8]) + 1)
          ;
          operator_delete((void *)local_148.first._M_string_length,(ulong)__position._M_current);
        }
        cVar8 = (pCVar24->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_engaged;
        pCVar10 = pCVar24;
        if ((bool)cVar8 == true) {
          if ((local_14c !=
               (pCVar24->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
               _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
               _M_value.bb_true) &&
             (local_14c !=
              (pCVar24->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
              _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
              _M_value.bb_false)) {
            local_191 = (ostream)0x0;
            AixLog::operator<<(&local_191,(Severity *)__position._M_current);
            local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
            local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
            local_148.first.field_2._M_allocated_capacity = 0;
            local_148.first.field_2._M_local_buf[8] = '\0';
            local_148.second._M_storage._0_1_ = 1;
            AixLog::operator<<((ostream *)&local_148,(Tag *)__position._M_current);
            local_b8 = std::chrono::_V2::system_clock::now();
            local_c0 = &PTR__Timestamp_001edeb0;
            local_b0 = 0;
            AixLog::operator<<((ostream *)&local_c0,(Timestamp *)__position._M_current);
            local_190 = &local_180;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_190,"translate_function","");
            local_170 = &local_160;
            pcVar20 = 
            "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
            ;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_170,
                       "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                       ,"");
            local_118._0_8_ = &PTR__Function_001edf10;
            local_118._8_8_ = local_118 + 0x18;
            if (local_190 == &local_180) {
              local_118._32_8_ = uStack_178;
            }
            else {
              local_118._8_8_ = local_190;
            }
            local_118._25_7_ = uStack_17f;
            local_118[0x18] = local_180;
            local_118._16_8_ = local_188;
            local_188 = (_Hash_node_base *)0x0;
            local_180 = '\0';
            local_f0._M_p = (pointer)&local_e0;
            if (local_170 == &local_160) {
              local_e0._8_8_ = local_160._8_8_;
            }
            else {
              local_f0._M_p = (pointer)local_170;
            }
            local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
            local_e0._M_local_buf[0] = local_160._M_local_buf[0];
            p_Stack_e8 = local_168;
            local_168 = (_Base_ptr)0x0;
            local_160._M_local_buf[0] = '\0';
            local_d0 = 0x35;
            local_c8 = false;
            local_190 = &local_180;
            local_170 = &local_160;
            AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,"Inline ruined by not next to source basic block",0x2f)
            ;
            cVar8 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
            __position._M_current =
                 (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)(ulong)(uint)(int)cVar8;
            std::ostream::put(-0x80);
            std::ostream::flush();
            AixLog::Function::~Function((Function *)local_118);
            if (local_170 != &local_160) {
              __position._M_current =
                   (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                   (CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1);
              operator_delete(local_170,(ulong)__position._M_current);
            }
            if (local_190 != &local_180) {
              __position._M_current =
                   (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                   (CONCAT71(uStack_17f,local_180) + 1);
              operator_delete(local_190,(ulong)__position._M_current);
            }
            local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
            if ((undefined1 *)local_148.first._M_string_length !=
                (undefined1 *)((long)&local_148.first.field_2 + 8)) {
              __position._M_current =
                   (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                   (CONCAT71(local_148.first.field_2._9_7_,local_148.first.field_2._M_local_buf[8])
                   + 1);
              operator_delete((void *)local_148.first._M_string_length,(ulong)__position._M_current)
              ;
            }
            cVar8 = '\0';
          }
          pCVar10 = local_a8;
          if (*(JumpInstructionKind *)&(blk->consts)._M_t._M_impl == BrCond) {
            uVar1 = puVar18[1];
            pCVar17 = local_a0;
            for (pCVar24 = (Codegen *)
                           (pCVar24->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent; pCVar24 != (Codegen *)0x0;
                pCVar24 = *(Codegen **)
                           (&(((set<int,_std::less<int>,_std::allocator<int>_> *)
                              &pCVar24->extra_data)->_M_t)._M_impl.field_0x0 + (ulong)bVar25 * 8)) {
              bVar25 = *(uint *)&(((_Rb_tree_header *)&pCVar24->inst)->_M_header)._M_parent < uVar1;
              if (!bVar25) {
                pCVar17 = pCVar24;
              }
            }
            pCVar24 = local_a0;
            if ((pCVar17 != local_a0) &&
               (pCVar24 = pCVar17,
               uVar1 < *(uint *)&(((_Rb_tree_header *)&pCVar17->inst)->_M_header)._M_parent)) {
              pCVar24 = local_a0;
            }
            __position._M_current =
                 (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)local_a0;
            if (*(undefined1 *)
                 ((long)&(((_Rb_tree_header *)&pCVar19->inst)->_M_header)._M_parent + 4) !=
                *(undefined1 *)
                 ((long)&(((_Rb_tree_header *)&pCVar24->inst)->_M_header)._M_parent + 4)) {
              local_191 = (ostream)0x0;
              pCVar10 = local_a0;
              AixLog::operator<<(&local_191,(Severity *)local_a0);
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
              local_148.first.field_2._M_allocated_capacity = 0;
              local_148.first.field_2._M_local_buf[8] = '\0';
              local_148.second._M_storage._0_1_ = 1;
              AixLog::operator<<((ostream *)&local_148,(Tag *)pCVar10);
              local_b8 = std::chrono::_V2::system_clock::now();
              local_c0 = &PTR__Timestamp_001edeb0;
              local_b0 = 0;
              AixLog::operator<<((ostream *)&local_c0,(Timestamp *)pCVar10);
              local_190 = &local_180;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_190,"translate_function","");
              local_170 = &local_160;
              pcVar20 = 
              "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_170,
                         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                         ,"");
              local_118._0_8_ = &PTR__Function_001edf10;
              local_118._8_8_ = local_118 + 0x18;
              if (local_190 == &local_180) {
                local_118._32_8_ = uStack_178;
              }
              else {
                local_118._8_8_ = local_190;
              }
              local_118._25_7_ = uStack_17f;
              local_118[0x18] = local_180;
              local_118._16_8_ = local_188;
              local_188 = (_Hash_node_base *)0x0;
              local_180 = '\0';
              local_f0._M_p = (pointer)&local_e0;
              if (local_170 == &local_160) {
                local_e0._8_8_ = local_160._8_8_;
              }
              else {
                local_f0._M_p = (pointer)local_170;
              }
              local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
              local_e0._M_local_buf[0] = local_160._M_local_buf[0];
              p_Stack_e8 = local_168;
              local_168 = (_Base_ptr)0x0;
              local_160._M_local_buf[0] = '\0';
              local_d0 = 0x3d;
              local_c8 = false;
              local_190 = &local_180;
              local_170 = &local_160;
              AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
              pcVar20 = "Inline ruined by hint not matching (this: ";
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,"Inline ruined by hint not matching (this: ",0x2a);
              AixLog::Function::~Function((Function *)local_118);
              if (local_170 != &local_160) {
                pcVar20 = (char *)(CONCAT71(local_160._M_allocated_capacity._1_7_,
                                            local_160._M_local_buf[0]) + 1);
                operator_delete(local_170,(ulong)pcVar20);
              }
              if (local_190 != &local_180) {
                pcVar20 = (char *)(CONCAT71(uStack_17f,local_180) + 1);
                operator_delete(local_190,(ulong)pcVar20);
              }
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              if ((undefined1 *)local_148.first._M_string_length !=
                  (undefined1 *)((long)&local_148.first.field_2 + 8)) {
                pcVar20 = (char *)(CONCAT71(local_148.first.field_2._9_7_,
                                            local_148.first.field_2._M_local_buf[8]) + 1);
                operator_delete((void *)local_148.first._M_string_length,(ulong)pcVar20);
              }
              CVar9 = *(undefined1 *)
                       ((long)&(((_Rb_tree_header *)&pCVar19->inst)->_M_header)._M_parent + 4);
              local_191 = (ostream)0x0;
              AixLog::operator<<(&local_191,(Severity *)pcVar20);
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
              local_148.first.field_2._M_allocated_capacity = 0;
              local_148.first.field_2._M_local_buf[8] = '\0';
              local_148.second._M_storage._0_1_ = 1;
              AixLog::operator<<((ostream *)&local_148,(Tag *)pcVar20);
              local_b8 = std::chrono::_V2::system_clock::now();
              local_c0 = &PTR__Timestamp_001edeb0;
              local_b0 = 0;
              AixLog::operator<<((ostream *)&local_c0,(Timestamp *)pcVar20);
              local_190 = &local_180;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_190,"translate_function","");
              local_170 = &local_160;
              pcVar20 = 
              "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_170,
                         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                         ,"");
              local_118._0_8_ = &PTR__Function_001edf10;
              local_118._8_8_ = local_118 + 0x18;
              if (local_190 == &local_180) {
                local_118._32_8_ = uStack_178;
              }
              else {
                local_118._8_8_ = local_190;
              }
              local_118._25_7_ = uStack_17f;
              local_118[0x18] = local_180;
              local_118._16_8_ = local_188;
              local_188 = (_Hash_node_base *)0x0;
              local_180 = '\0';
              local_f0._M_p = (pointer)&local_e0;
              if (local_170 == &local_160) {
                local_e0._8_8_ = local_160._8_8_;
              }
              else {
                local_f0._M_p = (pointer)local_170;
              }
              local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
              local_e0._M_local_buf[0] = local_160._M_local_buf[0];
              p_Stack_e8 = local_168;
              local_168 = (_Base_ptr)0x0;
              local_160._M_local_buf[0] = '\0';
              local_d0 = 0x3e;
              local_c8 = false;
              local_190 = &local_180;
              local_170 = &local_160;
              AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
              plVar21 = &std::clog;
              arm::display_cond(CVar9,(ostream *)&std::clog);
              AixLog::Function::~Function((Function *)local_118);
              if (local_170 != &local_160) {
                plVar21 = (long *)(CONCAT71(local_160._M_allocated_capacity._1_7_,
                                            local_160._M_local_buf[0]) + 1);
                operator_delete(local_170,(ulong)plVar21);
              }
              if (local_190 != &local_180) {
                plVar21 = (long *)(CONCAT71(uStack_17f,local_180) + 1);
                operator_delete(local_190,(ulong)plVar21);
              }
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              if ((undefined1 *)local_148.first._M_string_length !=
                  (undefined1 *)((long)&local_148.first.field_2 + 8)) {
                plVar21 = (long *)(CONCAT71(local_148.first.field_2._9_7_,
                                            local_148.first.field_2._M_local_buf[8]) + 1);
                operator_delete((void *)local_148.first._M_string_length,(ulong)plVar21);
              }
              local_191 = (ostream)0x0;
              AixLog::operator<<(&local_191,(Severity *)plVar21);
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
              local_148.first.field_2._M_allocated_capacity = 0;
              local_148.first.field_2._M_local_buf[8] = '\0';
              local_148.second._M_storage._0_1_ = 1;
              AixLog::operator<<((ostream *)&local_148,(Tag *)plVar21);
              local_b8 = std::chrono::_V2::system_clock::now();
              local_c0 = &PTR__Timestamp_001edeb0;
              local_b0 = 0;
              AixLog::operator<<((ostream *)&local_c0,(Timestamp *)plVar21);
              local_190 = &local_180;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_190,"translate_function","");
              local_170 = &local_160;
              pcVar20 = 
              "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_170,
                         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                         ,"");
              local_118._0_8_ = &PTR__Function_001edf10;
              local_118._8_8_ = local_118 + 0x18;
              if (local_190 == &local_180) {
                local_118._32_8_ = uStack_178;
              }
              else {
                local_118._8_8_ = local_190;
              }
              local_118._25_7_ = uStack_17f;
              local_118[0x18] = local_180;
              local_118._16_8_ = local_188;
              local_188 = (_Hash_node_base *)0x0;
              local_180 = '\0';
              local_f0._M_p = (pointer)&local_e0;
              if (local_170 == &local_160) {
                local_e0._8_8_ = local_160._8_8_;
              }
              else {
                local_f0._M_p = (pointer)local_170;
              }
              local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
              local_e0._M_local_buf[0] = local_160._M_local_buf[0];
              p_Stack_e8 = local_168;
              local_168 = (_Base_ptr)0x0;
              local_160._M_local_buf[0] = '\0';
              local_d0 = 0x3f;
              local_c8 = false;
              local_190 = &local_180;
              local_170 = &local_160;
              AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
              pcVar20 = ", next: ";
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,", next: ",8)
              ;
              AixLog::Function::~Function((Function *)local_118);
              if (local_170 != &local_160) {
                pcVar20 = (char *)(CONCAT71(local_160._M_allocated_capacity._1_7_,
                                            local_160._M_local_buf[0]) + 1);
                operator_delete(local_170,(ulong)pcVar20);
              }
              if (local_190 != &local_180) {
                pcVar20 = (char *)(CONCAT71(uStack_17f,local_180) + 1);
                operator_delete(local_190,(ulong)pcVar20);
              }
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              if ((undefined1 *)local_148.first._M_string_length !=
                  (undefined1 *)((long)&local_148.first.field_2 + 8)) {
                pcVar20 = (char *)(CONCAT71(local_148.first.field_2._9_7_,
                                            local_148.first.field_2._M_local_buf[8]) + 1);
                operator_delete((void *)local_148.first._M_string_length,(ulong)pcVar20);
              }
              CVar9 = *(undefined1 *)
                       ((long)&(((_Rb_tree_header *)&pCVar24->inst)->_M_header)._M_parent + 4);
              local_191 = (ostream)0x0;
              AixLog::operator<<(&local_191,(Severity *)pcVar20);
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
              local_148.first.field_2._M_allocated_capacity = 0;
              local_148.first.field_2._M_local_buf[8] = '\0';
              local_148.second._M_storage._0_1_ = 1;
              AixLog::operator<<((ostream *)&local_148,(Tag *)pcVar20);
              local_b8 = std::chrono::_V2::system_clock::now();
              local_c0 = &PTR__Timestamp_001edeb0;
              local_b0 = 0;
              AixLog::operator<<((ostream *)&local_c0,(Timestamp *)pcVar20);
              local_190 = &local_180;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_190,"translate_function","");
              local_170 = &local_160;
              pcVar20 = 
              "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_170,
                         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                         ,"");
              local_118._0_8_ = &PTR__Function_001edf10;
              local_118._8_8_ = local_118 + 0x18;
              if (local_190 == &local_180) {
                local_118._32_8_ = uStack_178;
              }
              else {
                local_118._8_8_ = local_190;
              }
              local_118._25_7_ = uStack_17f;
              local_118[0x18] = local_180;
              local_118._16_8_ = local_188;
              local_188 = (_Hash_node_base *)0x0;
              local_180 = '\0';
              local_f0._M_p = (pointer)&local_e0;
              if (local_170 == &local_160) {
                local_e0._8_8_ = local_160._8_8_;
              }
              else {
                local_f0._M_p = (pointer)local_170;
              }
              local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
              local_e0._M_local_buf[0] = local_160._M_local_buf[0];
              p_Stack_e8 = local_168;
              local_168 = (_Base_ptr)0x0;
              local_160._M_local_buf[0] = '\0';
              local_d0 = 0x40;
              local_c8 = false;
              local_190 = &local_180;
              local_170 = &local_160;
              AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
              plVar21 = &std::clog;
              arm::display_cond(CVar9,(ostream *)&std::clog);
              AixLog::Function::~Function((Function *)local_118);
              if (local_170 != &local_160) {
                plVar21 = (long *)(CONCAT71(local_160._M_allocated_capacity._1_7_,
                                            local_160._M_local_buf[0]) + 1);
                operator_delete(local_170,(ulong)plVar21);
              }
              if (local_190 != &local_180) {
                plVar21 = (long *)(CONCAT71(uStack_17f,local_180) + 1);
                operator_delete(local_190,(ulong)plVar21);
              }
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              if ((undefined1 *)local_148.first._M_string_length !=
                  (undefined1 *)((long)&local_148.first.field_2 + 8)) {
                plVar21 = (long *)(CONCAT71(local_148.first.field_2._9_7_,
                                            local_148.first.field_2._M_local_buf[8]) + 1);
                operator_delete((void *)local_148.first._M_string_length,(ulong)plVar21);
              }
              local_191 = (ostream)0x0;
              AixLog::operator<<(&local_191,(Severity *)plVar21);
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
              local_148.first.field_2._M_allocated_capacity = 0;
              local_148.first.field_2._M_local_buf[8] = '\0';
              local_148.second._M_storage._0_1_ = 1;
              AixLog::operator<<((ostream *)&local_148,(Tag *)plVar21);
              local_b8 = std::chrono::_V2::system_clock::now();
              local_c0 = &PTR__Timestamp_001edeb0;
              local_b0 = 0;
              AixLog::operator<<((ostream *)&local_c0,(Timestamp *)plVar21);
              local_190 = &local_180;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_190,"translate_function","");
              pcVar20 = 
              "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
              ;
              local_170 = &local_160;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_170,
                         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                         ,"");
              local_118._0_8_ = &PTR__Function_001edf10;
              local_118._8_8_ = local_118 + 0x18;
              if (local_190 == &local_180) {
                local_118._32_8_ = uStack_178;
              }
              else {
                local_118._8_8_ = local_190;
              }
              local_118._25_7_ = uStack_17f;
              local_118[0x18] = local_180;
              local_118._16_8_ = local_188;
              local_188 = (_Hash_node_base *)0x0;
              local_180 = '\0';
              local_f0._M_p = (pointer)&local_e0;
              if (local_170 == &local_160) {
                local_e0._8_8_ = local_160._8_8_;
              }
              else {
                local_f0._M_p = (pointer)local_170;
              }
              local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
              local_e0._M_local_buf[0] = local_160._M_local_buf[0];
              p_Stack_e8 = local_168;
              local_168 = (_Base_ptr)0x0;
              local_160._M_local_buf[0] = '\0';
              local_d0 = 0x41;
              local_c8 = false;
              local_190 = &local_180;
              local_170 = &local_160;
              AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
              cVar8 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
              __position._M_current =
                   (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)(ulong)(uint)(int)cVar8
              ;
              std::ostream::put(-0x80);
              std::ostream::flush();
              AixLog::Function::~Function((Function *)local_118);
              if (local_170 != &local_160) {
                __position._M_current =
                     (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                     (CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1)
                ;
                operator_delete(local_170,(ulong)__position._M_current);
              }
              if (local_190 != &local_180) {
                __position._M_current =
                     (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                     (CONCAT71(uStack_17f,local_180) + 1);
                operator_delete(local_190,(ulong)__position._M_current);
              }
              local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
              if ((undefined1 *)local_148.first._M_string_length !=
                  (undefined1 *)((long)&local_148.first.field_2 + 8)) {
                __position._M_current =
                     (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                     (CONCAT71(local_148.first.field_2._9_7_,local_148.first.field_2._M_local_buf[8]
                              ) + 1);
                operator_delete((void *)local_148.first._M_string_length,
                                (ulong)__position._M_current);
              }
              cVar8 = '\0';
              pCVar10 = local_a8;
            }
          }
        }
        pCVar24 = pCVar10;
        if (cVar8 != '\0') {
          CVar9 = (pCVar24->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                  _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                  _M_value.cond;
          if (local_14c ==
              (pCVar24->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
              _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
              _M_value.bb_true) {
            if ((puVar18 + 1 !=
                 (pCVar24->bb_ordering).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish) &&
               (puVar18[1] ==
                (pCVar24->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                _M_value.bb_false)) {
LAB_00162b66:
              puVar12 = local_98.
                        super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1;
              pIVar3 = local_98.
                       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
              local_98.
              super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = puVar12;
              if (pIVar3 != (Inst *)0x0) {
                (*(pIVar3->super_Displayable)._vptr_Displayable[2])();
              }
              (puVar12->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t
              .super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
              puVar12 = local_98.
                        super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1;
              pIVar3 = local_98.
                       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
              local_98.
              super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = puVar12;
              if (pIVar3 != (Inst *)0x0) {
                (*(pIVar3->super_Displayable)._vptr_Displayable[2])();
              }
              (puVar12->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t
              .super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
              pCVar24 = local_a8;
            }
          }
          else {
            CVar9 = arm::invert_cond(CVar9);
            if ((puVar18 + 1 !=
                 (pCVar24->bb_ordering).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish) &&
               (puVar18[1] ==
                (pCVar24->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                _M_value.bb_true)) goto LAB_00162b66;
            __position._M_current =
                 local_98.
                 super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -2;
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::_M_erase(&local_98,__position);
            (local_98.
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->cond =
                 (pCVar24->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
                 _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_payload.
                 _M_value.cond;
          }
          puVar2 = (pCVar24->inst).
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar12 = (pCVar24->inst).
                         super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2;
              puVar12 = puVar12 + 1) {
            ((puVar12->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->cond = CVar9;
          }
          (pCVar24->second_last_condition_code).super__Optional_base<arm::ConditionCode,_true,_true>
          ._M_payload.super__Optional_payload_base<arm::ConditionCode> =
               (_Optional_payload_base<arm::ConditionCode>)(CVar9 | 0x100);
        }
      }
      pCVar10 = (Codegen *)
                (pCVar24->inst).
                super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar19 = (Codegen *)
                     (pCVar24->inst).
                     super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pCVar19 != pCVar10;
          pCVar19 = (Codegen *)&pCVar19->package) {
        __position._M_current = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pCVar19;
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                    *)&local_98,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pCVar19);
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 !=
             (local_a8->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  puVar12 = (local_a8->inst).
            super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (local_a8->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar23 = puVar12;
  if (puVar2 != puVar12) {
    do {
      pIVar3 = (puVar23->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
               _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      if (pIVar3 != (Inst *)0x0) {
        (*(pIVar3->super_Displayable)._vptr_Displayable[2])();
      }
      (puVar23->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar23 = puVar23 + 1;
    } while (puVar23 != puVar2);
    (local_a8->inst).
    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar12;
  }
  pCVar10 = local_a8;
  generate_return_and_cleanup(local_a8);
  pCVar19 = (Codegen *)
            (pCVar10->inst).
            super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar10 = (Codegen *)
            (pCVar10->inst).
            super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar19 != pCVar10) {
    do {
      __position._M_current = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pCVar19;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&local_98,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pCVar19);
      pCVar19 = (Codegen *)&pCVar19->package;
    } while (pCVar19 != pCVar10);
  }
  local_14c = local_14c & 0xffffff00;
  AixLog::operator<<((ostream *)&local_14c,(Severity *)__position._M_current);
  local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
  local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
  local_148.first.field_2._M_allocated_capacity = 0;
  local_148.first.field_2._M_local_buf[8] = '\0';
  local_148.second._M_storage._0_1_ = 1;
  AixLog::operator<<((ostream *)&local_148,(Tag *)__position._M_current);
  pCVar19 = local_a8;
  local_b8 = std::chrono::_V2::system_clock::now();
  local_c0 = &PTR__Timestamp_001edeb0;
  local_b0 = 0;
  AixLog::operator<<((ostream *)&local_c0,(Timestamp *)__position._M_current);
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"translate_function","");
  pcVar20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp";
  local_170 = &local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
             ,"");
  local_118._8_8_ = local_118 + 0x18;
  local_118._0_8_ = &PTR__Function_001edf10;
  if (local_190 == &local_180) {
    local_118._32_8_ = uStack_178;
  }
  else {
    local_118._8_8_ = local_190;
  }
  local_118._25_7_ = uStack_17f;
  local_118[0x18] = local_180;
  local_f0._M_p = (pointer)&local_e0;
  local_118._16_8_ = local_188;
  local_188 = (_Hash_node_base *)0x0;
  local_180 = '\0';
  if (local_170 == &local_160) {
    local_e0._8_8_ = local_160._8_8_;
  }
  else {
    local_f0._M_p = (pointer)local_170;
  }
  local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
  local_e0._M_local_buf[0] = local_160._M_local_buf[0];
  p_Stack_e8 = local_168;
  local_168 = (_Base_ptr)0x0;
  local_160._M_local_buf[0] = '\0';
  local_d0 = 0x8c;
  local_c8 = false;
  local_190 = &local_180;
  local_170 = &local_160;
  AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"VariableToReg: ",0xf);
  cVar8 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  pTVar22 = (Tag *)(ulong)(uint)(int)cVar8;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_118);
  if (local_170 != &local_160) {
    pTVar22 = (Tag *)(CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1)
    ;
    operator_delete(local_170,(ulong)pTVar22);
  }
  if (local_190 != &local_180) {
    pTVar22 = (Tag *)(CONCAT71(uStack_17f,local_180) + 1);
    operator_delete(local_190,(ulong)pTVar22);
  }
  local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
  if ((undefined1 *)local_148.first._M_string_length !=
      (undefined1 *)((long)&local_148.first.field_2 + 8)) {
    pTVar22 = (Tag *)(CONCAT71(local_148.first.field_2._9_7_,local_148.first.field_2._M_local_buf[8]
                              ) + 1);
    operator_delete((void *)local_148.first._M_string_length,(ulong)pTVar22);
  }
  p_Var13 = (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = (Codegen *)&(pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header;
  if ((Codegen *)p_Var13 != local_a0) {
    do {
      local_14c = local_14c & 0xffffff00;
      AixLog::operator<<((ostream *)&local_14c,(Severity *)pTVar22);
      local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
      local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
      local_148.first.field_2._M_allocated_capacity = 0;
      local_148.first.field_2._M_local_buf[8] = '\0';
      local_148.second._M_storage._0_1_ = 1;
      AixLog::operator<<((ostream *)&local_148,pTVar22);
      local_b8 = std::chrono::_V2::system_clock::now();
      local_c0 = &PTR__Timestamp_001edeb0;
      local_b0 = 0;
      AixLog::operator<<((ostream *)&local_c0,(Timestamp *)pTVar22);
      local_190 = &local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"translate_function","");
      pcVar20 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
      ;
      local_170 = &local_160;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                 ,"");
      local_118._0_8_ = &PTR__Function_001edf10;
      local_118._8_8_ = local_118 + 0x18;
      local_f0._M_p = (pointer)&local_e0;
      if (local_190 == &local_180) {
        local_118._32_8_ = uStack_178;
      }
      else {
        local_118._8_8_ = local_190;
      }
      local_118._25_7_ = uStack_17f;
      local_118[0x18] = local_180;
      local_118._16_8_ = local_188;
      local_188 = (_Hash_node_base *)0x0;
      local_180 = '\0';
      if (local_170 == &local_160) {
        local_e0._8_8_ = local_160._8_8_;
      }
      else {
        local_f0._M_p = (pointer)local_170;
      }
      local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
      local_e0._M_local_buf[0] = local_160._M_local_buf[0];
      p_Stack_e8 = local_168;
      local_168 = (_Base_ptr)0x0;
      local_160._M_local_buf[0] = '\0';
      local_d0 = 0x8e;
      local_c8 = false;
      local_190 = &local_180;
      local_170 = &local_160;
      AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
      (*(code *)**(undefined8 **)(p_Var13 + 1))(p_Var13 + 1,&std::clog);
      pTVar22 = (Tag *)0x1bcf88;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," -> ",4);
      AixLog::Function::~Function((Function *)local_118);
      if (local_170 != &local_160) {
        pTVar22 = (Tag *)(CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0])
                         + 1);
        operator_delete(local_170,(ulong)pTVar22);
      }
      if (local_190 != &local_180) {
        pTVar22 = (Tag *)(CONCAT71(uStack_17f,local_180) + 1);
        operator_delete(local_190,(ulong)pTVar22);
      }
      local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
      if ((undefined1 *)local_148.first._M_string_length !=
          (undefined1 *)((long)&local_148.first.field_2 + 8)) {
        pTVar22 = (Tag *)(CONCAT71(local_148.first.field_2._9_7_,
                                   local_148.first.field_2._M_local_buf[8]) + 1);
        operator_delete((void *)local_148.first._M_string_length,(ulong)pTVar22);
      }
      local_14c = local_14c & 0xffffff00;
      AixLog::operator<<((ostream *)&local_14c,(Severity *)pTVar22);
      local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
      local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
      local_148.first.field_2._M_allocated_capacity = 0;
      local_148.first.field_2._M_local_buf[8] = '\0';
      local_148.second._M_storage._0_1_ = 1;
      AixLog::operator<<((ostream *)&local_148,pTVar22);
      local_b8 = std::chrono::_V2::system_clock::now();
      local_c0 = &PTR__Timestamp_001edeb0;
      local_b0 = 0;
      AixLog::operator<<((ostream *)&local_c0,(Timestamp *)pTVar22);
      local_190 = &local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"translate_function","");
      pcVar20 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
      ;
      local_170 = &local_160;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                 ,"");
      local_118._0_8_ = &PTR__Function_001edf10;
      local_118._8_8_ = local_118 + 0x18;
      local_f0._M_p = (pointer)&local_e0;
      if (local_190 == &local_180) {
        local_118._32_8_ = uStack_178;
      }
      else {
        local_118._8_8_ = local_190;
      }
      local_118._25_7_ = uStack_17f;
      local_118[0x18] = local_180;
      local_118._16_8_ = local_188;
      local_188 = (_Hash_node_base *)0x0;
      local_180 = '\0';
      if (local_170 == &local_160) {
        local_e0._8_8_ = local_160._8_8_;
      }
      else {
        local_f0._M_p = (pointer)local_170;
      }
      local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
      local_e0._M_local_buf[0] = local_160._M_local_buf[0];
      p_Stack_e8 = local_168;
      local_168 = (_Base_ptr)0x0;
      local_160._M_local_buf[0] = '\0';
      local_d0 = 0x8f;
      local_c8 = false;
      local_190 = &local_180;
      local_170 = &local_160;
      AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
      pTVar22 = (Tag *)(ulong)*(uint *)&p_Var13[1]._M_left;
      arm::display_reg_name((ostream *)&std::clog,*(uint *)&p_Var13[1]._M_left);
      AixLog::Function::~Function((Function *)local_118);
      if (local_170 != &local_160) {
        pTVar22 = (Tag *)(CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0])
                         + 1);
        operator_delete(local_170,(ulong)pTVar22);
      }
      if (local_190 != &local_180) {
        pTVar22 = (Tag *)(CONCAT71(uStack_17f,local_180) + 1);
        operator_delete(local_190,(ulong)pTVar22);
      }
      local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
      if ((undefined1 *)local_148.first._M_string_length !=
          (undefined1 *)((long)&local_148.first.field_2 + 8)) {
        pTVar22 = (Tag *)(CONCAT71(local_148.first.field_2._9_7_,
                                   local_148.first.field_2._M_local_buf[8]) + 1);
        operator_delete((void *)local_148.first._M_string_length,(ulong)pTVar22);
      }
      local_14c = local_14c & 0xffffff00;
      AixLog::operator<<((ostream *)&local_14c,(Severity *)pTVar22);
      local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
      local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
      local_148.first.field_2._M_allocated_capacity = 0;
      local_148.first.field_2._M_local_buf[8] = '\0';
      local_148.second._M_storage._0_1_ = 1;
      AixLog::operator<<((ostream *)&local_148,pTVar22);
      local_b8 = std::chrono::_V2::system_clock::now();
      local_c0 = &PTR__Timestamp_001edeb0;
      local_b0 = 0;
      AixLog::operator<<((ostream *)&local_c0,(Timestamp *)pTVar22);
      local_190 = &local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"translate_function","");
      pcVar20 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
      ;
      local_170 = &local_160;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                 ,"");
      local_118._0_8_ = &PTR__Function_001edf10;
      local_118._8_8_ = local_118 + 0x18;
      local_f0._M_p = (pointer)&local_e0;
      if (local_190 == &local_180) {
        local_118._32_8_ = uStack_178;
      }
      else {
        local_118._8_8_ = local_190;
      }
      local_118._25_7_ = uStack_17f;
      local_118[0x18] = local_180;
      local_118._16_8_ = local_188;
      local_188 = (_Hash_node_base *)0x0;
      local_180 = '\0';
      if (local_170 == &local_160) {
        local_e0._8_8_ = local_160._8_8_;
      }
      else {
        local_f0._M_p = (pointer)local_170;
      }
      local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
      local_e0._M_local_buf[0] = local_160._M_local_buf[0];
      p_Stack_e8 = local_168;
      local_168 = (_Base_ptr)0x0;
      local_160._M_local_buf[0] = '\0';
      local_d0 = 0x90;
      local_c8 = false;
      local_190 = &local_180;
      local_170 = &local_160;
      AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
      cVar8 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      pTVar22 = (Tag *)(ulong)(uint)(int)cVar8;
      std::ostream::put(-0x80);
      std::ostream::flush();
      AixLog::Function::~Function((Function *)local_118);
      if (local_170 != &local_160) {
        pTVar22 = (Tag *)(CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0])
                         + 1);
        operator_delete(local_170,(ulong)pTVar22);
      }
      if (local_190 != &local_180) {
        pTVar22 = (Tag *)(CONCAT71(uStack_17f,local_180) + 1);
        operator_delete(local_190,(ulong)pTVar22);
      }
      local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
      if ((undefined1 *)local_148.first._M_string_length !=
          (undefined1 *)((long)&local_148.first.field_2 + 8)) {
        pTVar22 = (Tag *)(CONCAT71(local_148.first.field_2._9_7_,
                                   local_148.first.field_2._M_local_buf[8]) + 1);
        operator_delete((void *)local_148.first._M_string_length,(ulong)pTVar22);
      }
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while ((Codegen *)p_Var13 != local_a0);
  }
  local_14c = local_14c & 0xffffff00;
  AixLog::operator<<((ostream *)&local_14c,(Severity *)pTVar22);
  local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
  local_148.first._M_string_length = (long)&local_148.first.field_2 + 8;
  local_148.first.field_2._M_allocated_capacity = 0;
  local_148.first.field_2._M_local_buf[8] = '\0';
  local_148.second._M_storage._0_1_ = 1;
  AixLog::operator<<((ostream *)&local_148,pTVar22);
  local_b8 = std::chrono::_V2::system_clock::now();
  local_c0 = &PTR__Timestamp_001edeb0;
  local_b0 = 0;
  AixLog::operator<<((ostream *)&local_c0,(Timestamp *)pTVar22);
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"translate_function","");
  pCVar19 = local_a8;
  pcVar20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp";
  local_170 = &local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
             ,"");
  local_118._0_8_ = &PTR__Function_001edf10;
  local_118._8_8_ = local_118 + 0x18;
  local_f0._M_p = (pointer)&local_e0;
  if (local_190 == &local_180) {
    local_118._32_8_ = uStack_178;
  }
  else {
    local_118._8_8_ = local_190;
  }
  local_118._25_7_ = uStack_17f;
  local_118[0x18] = local_180;
  local_118._16_8_ = local_188;
  local_188 = (_Hash_node_base *)0x0;
  local_180 = '\0';
  if (local_170 == &local_160) {
    local_e0._8_8_ = local_160._8_8_;
  }
  else {
    local_f0._M_p = (pointer)local_170;
  }
  local_e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
  local_e0._M_local_buf[0] = local_160._M_local_buf[0];
  p_Stack_e8 = local_168;
  local_168 = (_Base_ptr)0x0;
  local_160._M_local_buf[0] = '\0';
  local_d0 = 0x92;
  local_c8 = false;
  local_190 = &local_180;
  local_170 = &local_160;
  AixLog::operator<<((ostream *)local_118,(Function *)pcVar20);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_118);
  if (local_170 != &local_160) {
    operator_delete(local_170,
                    CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  local_148.first._M_dataplus._M_p = (pointer)&PTR__Tag_001edee0;
  if ((undefined1 *)local_148.first._M_string_length !=
      (undefined1 *)((long)&local_148.first.field_2 + 8)) {
    operator_delete((void *)local_148.first._M_string_length,
                    CONCAT71(local_148.first.field_2._9_7_,local_148.first.field_2._M_local_buf[8])
                    + 1);
  }
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::find(&pCVar19->extra_data->_M_t,
                  (key_type *)&::optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME_abi_cxx11_);
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
             *)pCVar19->extra_data;
  if (iVar14._M_node == (_Base_ptr)(this_00 + 8)) {
    local_118._0_8_ = &p_Stack_e8;
    local_118._16_8_ = (_Hash_node_base *)0x0;
    local_118._24_8_ = 0;
    local_118._8_8_ = (char *)0x1;
    local_118._32_8_ = 0x3f800000;
    local_f0._M_p = (pointer)0x0;
    p_Stack_e8 = (_Base_ptr)0x0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::
    pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>,_true>
              (&local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &::optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME_abi_cxx11_,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
                *)local_118);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::any>>(this_00,&local_148);
    if (local_148.second._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_148.second._M_manager)(_Op_destroy,&local_148.second,(_Arg *)0x0);
      local_148.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
      operator_delete(local_148.first._M_dataplus._M_p,
                      local_148.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_118);
    iVar14 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
             ::find(&pCVar19->extra_data->_M_t,
                    (key_type *)&::optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME_abi_cxx11_);
  }
  p_Var15 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             *)std::
               __any_caster<std::unordered_map<std::__cxx11::string,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>>>
                         ((any *)(iVar14._M_node + 2));
  if (p_Var15 !=
      (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
       *)0x0) {
    pcVar4 = (pCVar19->func->name)._M_dataplus._M_p;
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,pcVar4,pcVar4 + (pCVar19->func->name)._M_string_length);
    local_e0._M_allocated_capacity = (size_type)&local_f0;
    p_Stack_e8 = (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Stack_e8 == (_Base_ptr)0x0) {
      psVar16 = &local_d0;
      local_f0._M_p = (pointer)((ulong)local_f0._M_p._4_4_ << 0x20);
      p_Stack_e8 = (_Base_ptr)0x0;
      local_e0._8_8_ = local_e0._M_allocated_capacity;
    }
    else {
      local_f0._M_p._0_4_ = (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
      ;
      p_Var6 = (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_e0._8_8_ = (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      p_Stack_e8->_M_parent = (_Base_ptr)local_e0._M_allocated_capacity;
      psVar16 = &(pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_d0 = (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_a0;
      (pCVar19->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_a0
      ;
      local_e0._M_allocated_capacity = (size_type)p_Var6;
    }
    *psVar16 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>
              (p_Var15,local_118);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_unsigned_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_unsigned_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_unsigned_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_unsigned_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
                 *)(local_118 + 0x20));
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,
                      (ulong)((long)(_Hash_node_base **)local_118._16_8_ + 1));
    }
    pFVar7 = local_68;
    pMVar5 = local_a8->func;
    local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pMVar5->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (pMVar5->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    arm::Function::Function
              (local_68,&pMVar5->name,&local_78,&local_98,&local_a8->consts,local_a8->stack_size);
    if (local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_60);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::~vector(&local_98);
    return pFVar7;
  }
  std::__throw_bad_any_cast();
}

Assistant:

arm::Function Codegen::translate_function() {
  init_reg_map();
  scan_stack();
  scan();
  generate_startup();
  std::vector<std::unique_ptr<arm::Inst>> inst_sink = std::move(inst);
  std::set<uint32_t> vis;
  for (auto it = bb_ordering.begin(); it != bb_ordering.end(); it++) {
    auto bb_id = *it;
    inst.clear();
    auto& bb = func.basic_blks.at(bb_id);
    vis.insert(bb_id);
    translate_basic_block(bb);

    std::optional<arm::ConditionCode> second_last_cond =
        std::move(second_last_condition_code);
    second_last_condition_code = {};
    if (auto hint = inline_hint.find(bb_id);
        enable_cond_exec && hint != inline_hint.end()) {
      LOG(TRACE) << "Found inline hint for " << bb_id << std::endl;
      bool can_inline = last_jump.has_value();

      if (can_inline) {
        // for (auto& i : inst) {
        //   if (i->cond != arm::ConditionCode::Always) {
        //     can_inline = false;
        //     LOG(TRACE) << "Inline ruined by a conditional execution"
        //                << std::endl;
        //     break;
        //   }
        // }
        if (bb_id != last_jump->bb_true && bb_id != last_jump->bb_false) {
          can_inline = false;
          LOG(TRACE) << "Inline ruined by not next to source basic block"
                     << std::endl;
        }
        auto next_bb = *(it + 1);
        if (bb.jump.kind == mir::inst::JumpInstructionKind::BrCond) {
          if (auto next_hint = inline_hint.find(next_bb);
              hint != inline_hint.end() && hint->second != next_hint->second) {
            can_inline = false;
            LOG(TRACE) << "Inline ruined by hint not matching (this: ";
            display_cond(hint->second, LOG(TRACE));
            LOG(TRACE) << ", next: ";
            display_cond(next_hint->second, LOG(TRACE));
            LOG(TRACE) << std::endl;
          }
          // if (vis.find(bb.jump.bb_true) != vis.end() ||
          //     vis.find(bb.jump.bb_false) != vis.end()) {
          //   can_inline = false;
          //   LOG(TRACE)
          //       << "Inline ruined by finding successor block in visited set"
          //       << std::endl;
          // }
        }

        // else if (second_last_cond &&
        //            ((bb_id == last_jump->bb_true &&
        //              (*second_last_cond) != last_jump->cond) ||
        //             (bb_id == last_jump->bb_false &&
        //              (*second_last_cond) != invert_cond(last_jump->cond))))
        //              {
        //   can_inline = false;
        //   LOG(TRACE) << "Inline ruined by second last condition: ";
        //   display_cond(*second_last_cond, LOG(TRACE));
        //   LOG(TRACE) << " which conflicts with current one: ";
        //   display_cond(last_jump->cond, LOG(TRACE));
        //   LOG(TRACE) << std::endl;
        // }
      }
      if (can_inline) {
        // Calculate condition code to be used in this block
        ConditionCode cond;
        mir::types::LabelId expected_bb;
        bool inverted;
        if (bb_id == last_jump->bb_true) {
          cond = last_jump->cond;
          expected_bb = last_jump->bb_false;
          inverted = false;
          if (it + 1 != bb_ordering.end() && *(it + 1) == last_jump->bb_false) {
            inst_sink.pop_back();
            inst_sink.pop_back();
          } else {
          }
        } else {
          cond = invert_cond(last_jump->cond);
          expected_bb = last_jump->bb_true;
          inverted = true;
          // since a conditional branch is always emitted in the fashion of
          // "bb_false, bb_true", we can safely pop the second-to-last branch
          // operation and add the condition to bb_true
          if (it + 1 != bb_ordering.end() && *(it + 1) == last_jump->bb_true) {
            inst_sink.pop_back();
            inst_sink.pop_back();
          } else {
            inst_sink.erase(inst_sink.end() - 2);
            inst_sink.back()->cond = last_jump->cond;
          }
        }

        for (auto& i : inst) {
          i->cond = cond;
        }

        second_last_condition_code = cond;
      }
    }

    for (auto& i : inst) {
      inst_sink.push_back(std::move(i));
    }
  }
  inst.clear();
  generate_return_and_cleanup();
  for (auto& i : inst) {
    inst_sink.push_back(std::move(i));
  }

  {
#pragma region passShow
    LOG(TRACE) << "VariableToReg: " << std::endl;
    for (auto& v : reg_map) {
      LOG(TRACE) << v.first << " -> ";
      display_reg_name(LOG(TRACE), v.second);
      LOG(TRACE) << std::endl;
    }
    LOG(TRACE) << std::endl;
#pragma endregion
  }

  {
    // Put variable to vreg map in extra data
    auto data =
        extra_data.find(optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME);
    if (data == extra_data.end()) {
      extra_data.insert({optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME,
                         optimization::MirVariableToArmVRegType()});
      data = extra_data.find(optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME);
    }
    auto& map =
        std::any_cast<optimization::MirVariableToArmVRegType&>(data->second);
    map.insert({func.name, std::move(this->reg_map)});
  }

  return arm::Function(func.name, func.type, std::move(inst_sink),
                       std::move(this->consts), stack_size);
}